

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O3

void mat_inf_norm_rows(csc *M,c_float *E)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  c_int *pcVar5;
  c_float *pcVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  if (0 < M->m) {
    memset(E,0,M->m << 3);
  }
  lVar2 = M->n;
  if (0 < lVar2) {
    plVar3 = M->p;
    lVar7 = 0;
    lVar8 = *plVar3;
    do {
      lVar4 = plVar3[lVar7 + 1];
      if (lVar8 < lVar4) {
        pcVar5 = M->i;
        pcVar6 = M->x;
        do {
          dVar1 = pcVar6[lVar8];
          dVar9 = -dVar1;
          if (-dVar1 <= dVar1) {
            dVar9 = dVar1;
          }
          if (dVar9 <= E[pcVar5[lVar8]]) {
            dVar9 = E[pcVar5[lVar8]];
          }
          E[pcVar5[lVar8]] = dVar9;
          lVar8 = lVar8 + 1;
        } while (lVar4 != lVar8);
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar4;
    } while (lVar7 != lVar2);
  }
  return;
}

Assistant:

void mat_inf_norm_rows(const csc *M, c_float *E) {
  c_int i, j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->m; j++) {
    E[j] = 0.;
  }

  // Compute maximum across rows
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i    = M->i[ptr];
      E[i] = c_max(c_absval(M->x[ptr]), E[i]);
    }
  }
}